

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitMemory(PrintSExpression *this,Memory *curr)

{
  bool bVar1;
  ostream *poVar2;
  Memory *curr_local;
  PrintSExpression *this_local;
  
  bVar1 = Importable::imported(&curr->super_Importable);
  if (bVar1) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    emitImportHeader(this,&curr->super_Importable);
    printMemoryHeader(this,curr);
    poVar2 = std::operator<<(this->o,')');
    std::operator<<(poVar2,this->maybeNewLine);
  }
  else {
    doIndent(this->o,this->indent);
    printMemoryHeader(this,curr);
    std::operator<<(this->o,'\n');
  }
  return;
}

Assistant:

void PrintSExpression::visitMemory(Memory* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printMemoryHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printMemoryHeader(curr);
    o << '\n';
  }
}